

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O2

void ssw_update_nparticles
               (mcpl_generic_wfilehandle_t *fh,int64_t np1pos,int32_t np1,int64_t nrsspos,
               int32_t nrss)

{
  uint64_t uVar1;
  int32_t nrss_local;
  int32_t np1_local;
  
  _nrss_local = CONCAT44(np1,nrss);
  uVar1 = fh->current_pos;
  mcpl_generic_fwseek();
  mcpl_generic_fwrite(fh,&np1_local,4);
  mcpl_generic_fwseek(fh,nrsspos);
  mcpl_generic_fwrite(fh,&nrss_local,4);
  mcpl_generic_fwseek(fh,uVar1);
  return;
}

Assistant:

void ssw_update_nparticles( mcpl_generic_wfilehandle_t* fh,
                            int64_t np1pos, int32_t np1,
                            int64_t nrsspos, int32_t nrss)
{
  //Seek and update np1 and nrss fields at correct location in header:
  uint64_t savedpos = fh->current_pos;
  mcpl_generic_fwseek( fh, np1pos );
  mcpl_generic_fwrite( fh, (char*)&np1, sizeof(np1) );
  mcpl_generic_fwseek( fh, nrsspos );
  mcpl_generic_fwrite( fh, (char*)&nrss, sizeof(nrss) );
  mcpl_generic_fwseek( fh, savedpos );
}